

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_mul_n_by_m_template.h
# Opt level: O0

bool __thiscall
test_uintwide_t_n_binary_ops_mul_n_by_m_template<12288U,_8192U,_unsigned_int>::do_test
          (test_uintwide_t_n_binary_ops_mul_n_by_m_template<12288U,_8192U,_unsigned_int> *this,
          size_t rounds)

{
  bool bVar1;
  uint uVar2;
  ostream *poVar3;
  void *pvVar4;
  bool local_31;
  ulong local_28;
  size_t i;
  bool result_is_ok;
  size_t rounds_local;
  test_uintwide_t_n_binary_ops_mul_n_by_m_template<12288U,_8192U,_unsigned_int> *this_local;
  
  i._7_1_ = true;
  for (local_28 = 0; local_28 < rounds; local_28 = local_28 + 1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "initialize()       boost compare with uintwide_t: round ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
    poVar3 = std::operator<<(poVar3,",  digits2: ");
    uVar2 = (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
              _vptr_test_uintwide_t_n_base[2])();
    pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
      _vptr_test_uintwide_t_n_base[3])();
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "test_binary_mul()  boost compare with uintwide_t: round ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
    poVar3 = std::operator<<(poVar3,",  digits2: ");
    uVar2 = (*(this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
              _vptr_test_uintwide_t_n_base[2])();
    pvVar4 = (void *)std::ostream::operator<<(poVar3,uVar2);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    bVar1 = test_binary_mul(this);
    local_31 = false;
    if (bVar1) {
      local_31 = i._7_1_;
    }
    i._7_1_ = local_31;
  }
  return i._7_1_;
}

Assistant:

auto do_test(std::size_t rounds) -> bool override
    {
      bool result_is_ok = true;

      for(std::size_t i = 0U; i < rounds; ++i)
      {
        std::cout << "initialize()       boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        this->initialize();

        std::cout << "test_binary_mul()  boost compare with uintwide_t: round " << i << ",  digits2: " << this->get_digits2() << std::endl;
        result_is_ok = (test_binary_mul() && result_is_ok);
      }

      return result_is_ok;
    }